

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O3

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  char cVar5;
  uint __c;
  
  if ((optreset == 0) && (cVar5 = *getopt::place, cVar5 != '\0')) {
LAB_0018e7ac:
    pcVar4 = getopt::place + 1;
    __c = (uint)cVar5;
    uVar3 = 0x3a;
    getopt::place = pcVar4;
    optopt = __c;
    if (cVar5 != ':') {
      pcVar2 = strchr(__shortopts,__c);
      if (pcVar2 != (char *)0x0) goto LAB_0018e817;
      uVar3 = (ulong)__c;
      if (cVar5 == '-') {
        return -1;
      }
    }
    if (*pcVar4 == '\0') {
      optind = optind + 1;
    }
    if (opterr == 0) {
      return 0x3f;
    }
    if (*__shortopts == ':') {
      return 0x3f;
    }
    pcVar4 = "illegal option -- %c\n";
LAB_0018e7fb:
    printf(pcVar4,uVar3);
    return 0x3f;
  }
  optreset = 0;
  if ((___argc <= optind) || (pcVar4 = ___argv[optind], *pcVar4 != '-')) {
LAB_0018e745:
    getopt::place = "";
    optreset = 0;
    return -1;
  }
  cVar5 = pcVar4[1];
  if (cVar5 != '\0') {
    if (cVar5 == '-') {
      optind = optind + 1;
      goto LAB_0018e745;
    }
    getopt::place = pcVar4 + 1;
    goto LAB_0018e7ac;
  }
  pcVar4 = pcVar4 + 1;
  optopt = 0x2d;
  __c = 0x2d;
  getopt::place = pcVar4;
  pcVar2 = strchr(__shortopts,0x2d);
  if (pcVar2 == (char *)0x0) {
    return -1;
  }
LAB_0018e817:
  if (pcVar2[1] != ':') {
    if (*pcVar4 == '\0') {
      optind = optind + 1;
      optarg = (char *)0x0;
      return __c;
    }
    optarg = (char *)0x0;
    return __c;
  }
  if (*pcVar4 == '\0') {
    iVar1 = optind + 1;
    if (___argc <= iVar1) {
      getopt::place = "";
      if (*__shortopts == ':') {
        optind = iVar1;
        return 0x3a;
      }
      if (opterr == 0) {
        optind = iVar1;
        return 0x3f;
      }
      pcVar4 = "option requires an argument -- %c\n";
      uVar3 = (ulong)__c;
      optind = iVar1;
      goto LAB_0018e7fb;
    }
    pcVar4 = ___argv[(long)optind + 1];
    optind = iVar1;
  }
  getopt::place = "";
  optind = optind + 1;
  optarg = pcVar4;
  return __c;
}

Assistant:

int getopt(int nargc, char * const nargv[], const char *ostr)
{
	static char *place = EMSG;              /* option letter processing */
	const char *oli;                              /* option letter list index */

	if (optreset || !*place) {              /* update scanning pointer */
		optreset = 0;
		if (optind >= nargc || *(place = nargv[optind]) != '-') {
			place = EMSG;
			return (-1);
		}
		if (place[1] && *++place == '-') {      /* found "--" */
			++optind;
			place = EMSG;
			return (-1);
		}
	}                                       /* option letter okay? */
	if ((optopt = (int)*place++) == (int)':' ||
		!(oli = strchr(ostr, optopt))) {
		/*
		* if the user didn't specify '-' as an option,
		* assume it means -1.
		*/
		if (optopt == (int)'-')
			return (-1);
		if (!*place)
			++optind;
		if (opterr && *ostr != ':')
			(void)printf("illegal option -- %c\n", optopt);
		return (BADCH);
	}
	if (*++oli != ':') {                    /* don't need argument */
		optarg = NULL;
		if (!*place)
			++optind;
	}
	else {                                  /* need an argument */
		if (*place)                     /* no white space */
			optarg = place;
		else if (nargc <= ++optind) {   /* no arg */
			place = EMSG;
			if (*ostr == ':')
				return (BADARG);
			if (opterr)
				(void)printf("option requires an argument -- %c\n", optopt);
			return (BADCH);
		}
		else                            /* white space */
			optarg = nargv[optind];
		place = EMSG;
		++optind;
	}
	return (optopt);                        /* dump back option letter */
}